

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O2

void __thiscall
soul::AST::Context::throwError(Context *this,CompileMessage *message,bool isStaticAssertion)

{
  pool_ptr<soul::AST::FunctionCall> *this_00;
  int iVar1;
  undefined4 extraout_var;
  FunctionCall *pFVar3;
  Function *pFVar4;
  string *psVar5;
  SourceCodeText *pSVar6;
  Scope *pSVar7;
  CompileMessage error;
  CompileMessageGroup messages;
  CodeLocation local_1b0;
  CompileMessage local_1a0;
  string local_168;
  string local_148;
  undefined1 local_128 [248];
  long lVar2;
  undefined4 extraout_var_00;
  
  local_128._0_8_ = local_128 + 0x18;
  local_128._8_8_ = 0;
  local_128._16_8_ = 4;
  local_1b0.sourceCode.object = (this->location).sourceCode.object;
  if (local_1b0.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_1b0.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_1b0.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_1b0.location.data = (this->location).location.data;
  CompileMessage::withLocation(&local_1a0,message,&local_1b0);
  ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
            ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_128,&local_1a0);
  CompileMessage::~CompileMessage(&local_1a0);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_1b0.sourceCode);
  pSVar7 = this->parentScope;
  while ((pSVar7 != (Scope *)0x0 && ((ulong)local_128._8_8_ < 10))) {
    iVar1 = (*pSVar7->_vptr_Scope[8])(pSVar7);
    lVar2 = CONCAT44(extraout_var,iVar1);
    if ((lVar2 != 0) && (*(long *)(lVar2 + 0xa8) != 0)) {
      this_00 = (pool_ptr<soul::AST::FunctionCall> *)(lVar2 + 0xa8);
      pFVar3 = pool_ptr<soul::AST::FunctionCall>::operator->(this_00);
      pFVar4 = pool_ptr<soul::AST::Function>::operator->
                         ((pool_ptr<soul::AST::Function> *)(lVar2 + 0xa0));
      psVar5 = Identifier::operator_cast_to_string_(&pFVar4->name);
      std::__cxx11::string::string((string *)&local_148,(string *)psVar5);
      CallOrCastBase::getDescription(&local_168,&pFVar3->super_CallOrCastBase,&local_148);
      std::operator+(&local_1a0.description,"Failed to instantiate generic function ",&local_168);
      pFVar3 = pool_ptr<soul::AST::FunctionCall>::operator->(this_00);
      local_1a0.location.sourceCode.object =
           (pFVar3->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.
           location.sourceCode.object;
      if (local_1a0.location.sourceCode.object != (SourceCodeText *)0x0) {
        ((local_1a0.location.sourceCode.object)->super_RefCountedObject).refCount =
             ((local_1a0.location.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      local_1a0.location.location.data =
           (pFVar3->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.context.
           location.location.data;
      local_1a0.type = error;
      local_1a0.category = none;
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&local_148);
      pSVar6 = RefCountedPtr<soul::SourceCodeText>::operator->
                         ((RefCountedPtr<soul::SourceCodeText> *)this);
      if (pSVar6->isInternal == true) {
        ArrayWithPreallocation<soul::CompileMessage,_4UL>::clear
                  ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_128);
        if (isStaticAssertion) {
          std::__cxx11::string::_M_assign((string *)&local_1a0);
        }
        else {
          std::operator+(&local_168,", error: ",&message->description);
          std::__cxx11::string::append((string *)&local_1a0);
          std::__cxx11::string::~string((string *)&local_168);
        }
        ArrayWithPreallocation<soul::CompileMessage,_4UL>::push_back
                  ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_128,&local_1a0);
      }
      else {
        ArrayWithPreallocation<soul::CompileMessage,_4UL>::insert
                  ((ArrayWithPreallocation<soul::CompileMessage,_4UL> *)local_128,
                   (CompileMessage *)local_128._0_8_,&local_1a0);
      }
      pFVar3 = pool_ptr<soul::AST::FunctionCall>::operator->(this_00);
      pSVar7 = (pFVar3->super_CallOrCastBase).super_Expression.super_Statement.super_ASTObject.
               context.parentScope;
      CompileMessage::~CompileMessage(&local_1a0);
    }
    iVar1 = (*pSVar7->_vptr_Scope[4])(pSVar7);
    pSVar7 = (Scope *)CONCAT44(extraout_var_00,iVar1);
  }
  soul::throwError((CompileMessageGroup *)local_128);
}

Assistant:

[[noreturn]] void throwError (CompileMessage message, bool isStaticAssertion = false) const
        {
            CompileMessageGroup messages;
            messages.messages.push_back (message.withLocation (location));

            for (auto p = parentScope; p != nullptr && messages.messages.size() < 10; p = p->getParentScope())
            {
                if (auto f = p->getAsFunction())
                {
                    if (f->originalCallLeadingToSpecialisation != nullptr)
                    {
                        CompileMessage error { "Failed to instantiate generic function "
                                                  + f->originalCallLeadingToSpecialisation->getDescription (f->originalGenericFunction->name),
                                               f->originalCallLeadingToSpecialisation->context.location,
                                               CompileMessage::Type::error };

                        if (location.sourceCode->isInternal)
                        {
                            messages.messages.clear();

                            if (isStaticAssertion)
                                error.description = message.description;
                            else
                                error.description += ", error: " + message.description;

                            messages.messages.push_back (error);
                        }
                        else
                        {
                            messages.messages.insert (messages.messages.begin(), error);
                        }

                        p = f->originalCallLeadingToSpecialisation->context.parentScope;
                    }
                }
            }

            soul::throwError (messages);
        }